

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_c_glib_generator.cc
# Opt level: O0

void __thiscall
t_c_glib_generator::generate_serialize_struct
          (t_c_glib_generator *this,ostream *out,t_struct *tstruct,string *prefix,int error_ret)

{
  ostream *poVar1;
  string local_a0;
  string local_80;
  string local_50;
  int local_2c;
  string *psStack_28;
  int error_ret_local;
  string *prefix_local;
  t_struct *tstruct_local;
  ostream *out_local;
  t_c_glib_generator *this_local;
  
  local_2c = error_ret;
  psStack_28 = prefix;
  prefix_local = (string *)tstruct;
  tstruct_local = (t_struct *)out;
  out_local = (ostream *)this;
  t_generator::indent_abi_cxx11_(&local_50,(t_generator *)this);
  poVar1 = std::operator<<(out,(string *)&local_50);
  poVar1 = std::operator<<(poVar1,"if ((ret = thrift_struct_write (THRIFT_STRUCT (");
  poVar1 = std::operator<<(poVar1,(string *)prefix);
  poVar1 = std::operator<<(poVar1,"), protocol, error)) < 0)");
  poVar1 = std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_80,(t_generator *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_80);
  poVar1 = std::operator<<(poVar1,"  return ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_2c);
  poVar1 = std::operator<<(poVar1,";");
  poVar1 = std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_a0,(t_generator *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_a0);
  poVar1 = std::operator<<(poVar1,"xfer += ret;");
  poVar1 = std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void t_c_glib_generator::generate_serialize_struct(ostream& out,
                                                   t_struct* tstruct,
                                                   string prefix,
                                                   int error_ret) {
  (void)tstruct;
  out << indent() << "if ((ret = thrift_struct_write (THRIFT_STRUCT (" << prefix
      << "), protocol, error)) < 0)" << endl << indent() << "  return " << error_ret << ";" << endl
      << indent() << "xfer += ret;" << endl << endl;
}